

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O2

void __thiscall
Logger::log<signed_char,signed_char>
          (Logger *this,char *id,uint64_t pTime,uint64_t pThread,char *ts,char *ts_1)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  logful_context_t ctx;
  uint8_t logbuff [8192];
  
  if (this->mLogful == true) {
    ctx.tokenFormat._M_dataplus._M_p = (pointer)&ctx.tokenFormat.field_2;
    ctx.tokenFormat._M_string_length = 0;
    ctx.tokenFormat.field_2._M_local_buf[0] = '\0';
    iVar1 = sprintf((char *)logbuff,"%lluus %llut ",pTime);
    lVar3 = (long)iVar1;
    sVar2 = logful<signed_char,signed_char>(this,&ctx,logbuff + lVar3,id,*ts,*ts_1);
    logbuff[sVar2 + lVar3] = '\n';
    write(1,logbuff,sVar2 + lVar3 + 1);
    std::__cxx11::string::~string((string *)&ctx);
  }
  logbuff._0_8_ = (long)id - (long)LoggerRef;
  logbuff[0x1b] = *ts;
  logbuff[0x1d] = *ts_1;
  logbuff[8] = 0xa7;
  logbuff[0x11] = 0xa7;
  logbuff[0x1a] = 0xa2;
  logbuff[0x1c] = 0xa2;
  logbuff[0x1e] = '\0';
  logbuff._9_8_ = pTime;
  logbuff._18_8_ = pThread;
  fwrite(logbuff,1,0x1f,(FILE *)this->mOutputFile);
  return;
}

Assistant:

void log(const char * id, uint64_t pTime, uint64_t pThread, const Ts&... ts)
    {
        if (mLogful)
        {
            logful_context_t ctx;
            uint8_t logbuff[4096*2];
            int flen = std::sprintf((char*)logbuff, "%lluus %llut ", (unsigned long long)pTime, (unsigned long long)pThread);
            size_t sz = flen + 
            logful(ctx, logbuff + flen, id, ts...);
            logbuff[sz++] = '\n';
            [[maybe_unused]] auto rv = ::write(1, logbuff, sz);
        }
        {
            uint8_t buffer[2048];
            uint8_t* usedBuffer = buffer;
            new (usedBuffer) HeaderType(intptr_t(id)-intptr_t(LoggerRef));
            usedBuffer += sizeof(HeaderType);
            size_t sz = logless(usedBuffer, pTime, pThread, ts...) + sizeof(HeaderType);
            std::fwrite((char*)buffer, 1, sz, mOutputFile);
        }
    }